

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O0

bool __thiscall OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,EdgeHandle _eh)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  undefined1 local_29;
  PolyConnectivity *this_local;
  EdgeHandle _eh_local;
  
  HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,0);
  bVar1 = is_boundary(this,HVar2);
  local_29 = true;
  if (!bVar1) {
    HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
    local_29 = is_boundary(this,HVar2);
  }
  return local_29;
}

Assistant:

bool is_boundary(EdgeHandle _eh) const
  {
    return (is_boundary(halfedge_handle(_eh, 0)) ||
            is_boundary(halfedge_handle(_eh, 1)));
  }